

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

ssize_t xar_write_data(archive_write *a,void *buff,size_t s)

{
  ulong uVar1;
  void *buff_00;
  long *plVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  la_int64_t lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_t size;
  size_t size_00;
  ulong uVar13;
  bool bVar14;
  
  pvVar3 = a->format_data;
  uVar13 = *(ulong *)((long)pvVar3 + 0x48);
  size_00 = s;
  if (uVar13 < s) {
    size_00 = uVar13;
  }
  if ((size_00 == 0) || (*(long *)((long)pvVar3 + 0x40) == 0)) {
    return 0;
  }
  if (*(int *)(*(long *)((long)pvVar3 + 0x40) + 0xf8) == 0) {
    checksum_update((chksumwork_conflict *)((long)pvVar3 + 0xb0),buff,size_00);
    lVar11 = 0x98;
    uVar13 = size_00;
  }
  else {
    *(void **)((long)pvVar3 + 200) = buff;
    *(size_t *)((long)pvVar3 + 0xd0) = size_00;
    buff_00 = (void *)((long)pvVar3 + 0x120);
    size = 0;
    while( true ) {
      uVar4 = 0;
      if ((*(int *)((long)pvVar3 + 0xf8) != 0) &&
         (uVar4 = (**(code **)((long)pvVar3 + 0x108))(a,(long)pvVar3 + 200,s < uVar13), 1 < uVar4))
      {
        return -0x1e;
      }
      if (s < uVar13 && *(long *)((long)pvVar3 + 0xe8) != 0) break;
      size = 0x10000 - *(long *)((long)pvVar3 + 0xe8);
      checksum_update((chksumwork_conflict *)((long)pvVar3 + 0x98),buff_00,size);
      plVar2 = (long *)(*(long *)((long)pvVar3 + 0x40) + 0xe8);
      *plVar2 = *plVar2 + size;
      iVar5 = write_to_temp(a,buff_00,size);
      if (iVar5 != 0) {
        return -0x1e;
      }
      if (uVar4 != 0) break;
      *(void **)((long)pvVar3 + 0xe0) = buff_00;
      *(undefined8 *)((long)pvVar3 + 0xe8) = 0x10000;
    }
    uVar13 = size_00 - *(long *)((long)pvVar3 + 0xd0);
    lVar11 = 0xb0;
    size_00 = size;
  }
  checksum_update((chksumwork_conflict *)(lVar11 + (long)pvVar3),buff,uVar13);
  lVar11 = *(long *)((long)pvVar3 + 0x48);
  lVar6 = archive_entry_size(*(archive_entry **)(*(long *)((long)pvVar3 + 0x40) + 0x20));
  lVar12 = *(long *)((long)pvVar3 + 0x40);
  if ((((lVar11 == lVar6) && (*(undefined8 *)(lVar12 + 0x158) = 0, 2 < uVar13)) && (*buff == '#'))
     && (*(char *)((long)buff + 1) == '!')) {
    uVar7 = (ulong)(*(char *)((long)buff + 2) == ' ');
    uVar1 = uVar7 + 2;
    uVar10 = uVar13 - uVar1;
    uVar7 = uVar7 | 0x1002;
    if (uVar10 < 0x1001) {
      uVar7 = uVar13;
    }
    uVar8 = uVar1;
    if (0xfff < uVar10) {
      uVar10 = 0x1000;
    }
    while ((bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, uVar9 = uVar7, bVar14 &&
           ((0x20 < (ulong)*(byte *)((long)buff + uVar8) ||
            (uVar9 = uVar8, (0x100002601U >> ((ulong)*(byte *)((long)buff + uVar8) & 0x3f) & 1) == 0
            ))))) {
      uVar8 = uVar8 + 1;
    }
    archive_strncat((archive_string *)(lVar12 + 0x150),(void *)(uVar1 + (long)buff),uVar9 - uVar1);
    lVar12 = *(long *)((long)pvVar3 + 0x40);
  }
  if (*(int *)(lVar12 + 0xf8) == 0) {
    iVar5 = write_to_temp(a,buff,size_00);
    if (iVar5 != 0) {
      return -0x1e;
    }
    plVar2 = (long *)(*(long *)((long)pvVar3 + 0x40) + 0xe8);
    *plVar2 = *plVar2 + size_00;
  }
  *(long *)((long)pvVar3 + 0x48) = *(long *)((long)pvVar3 + 0x48) - uVar13;
  return uVar13;
}

Assistant:

static ssize_t
xar_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	enum la_zaction run;
	size_t size = 0;
	size_t rsize;
	int r;

	xar = (struct xar *)a->format_data;

	if (s > xar->bytes_remaining)
		s = (size_t)xar->bytes_remaining;
	if (s == 0 || xar->cur_file == NULL)
		return (0);
	if (xar->cur_file->data.compression == NONE) {
		checksum_update(&(xar->e_sumwrk), buff, s);
		checksum_update(&(xar->a_sumwrk), buff, s);
		size = rsize = s;
	} else {
		xar->stream.next_in = (const unsigned char *)buff;
		xar->stream.avail_in = s;
		if (xar->bytes_remaining > s)
			run = ARCHIVE_Z_RUN;
		else
			run = ARCHIVE_Z_FINISH;
		/* Compress file data. */
		for (;;) {
			r = compression_code(&(a->archive), &(xar->stream),
			    run);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
				return (ARCHIVE_FATAL);
			if (xar->stream.avail_out == 0 ||
			    run == ARCHIVE_Z_FINISH) {
				size = sizeof(xar->wbuff) -
				    xar->stream.avail_out;
				checksum_update(&(xar->a_sumwrk), xar->wbuff,
				    size);
				xar->cur_file->data.length += size;
				if (write_to_temp(a, xar->wbuff,
				    size) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				if (r == ARCHIVE_OK) {
					/* Output buffer was full */
					xar->stream.next_out = xar->wbuff;
					xar->stream.avail_out =
					    sizeof(xar->wbuff);
				} else {
					/* ARCHIVE_EOF - We are done */
					break;
				}
			} else {
				/* Compressor wants more input */
				break;
			}
		}
		rsize = s - xar->stream.avail_in;
		checksum_update(&(xar->e_sumwrk), buff, rsize);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	if (xar->bytes_remaining ==
	    (uint64_t)archive_entry_size(xar->cur_file->entry)) {
		/*
		 * Get the path of a shell script if so.
		 */
		const unsigned char *b = (const unsigned char *)buff;

		archive_string_empty(&(xar->cur_file->script));
		if (rsize > 2 && b[0] == '#' && b[1] == '!') {
			size_t i, end, off;

			off = 2;
			if (b[off] == ' ')
				off++;
#ifdef PATH_MAX
			if ((rsize - off) > PATH_MAX)
				end = off + PATH_MAX;
			else
#endif
				end = rsize;
			/* Find the end of a script path. */
			for (i = off; i < end && b[i] != '\0' &&
			    b[i] != '\n' && b[i] != '\r' &&
			    b[i] != ' ' && b[i] != '\t'; i++)
				;
			archive_strncpy(&(xar->cur_file->script), b + off,
			    i - off);
		}
	}
#endif

	if (xar->cur_file->data.compression == NONE) {
		if (write_to_temp(a, buff, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xar->cur_file->data.length += size;
	}
	xar->bytes_remaining -= rsize;

	return (rsize);
}